

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-pool.c
# Opt level: O2

MMDB_data_pool_s * data_pool_new(size_t size)

{
  MMDB_data_pool_s *pool;
  MMDB_entry_data_list_s *pMVar1;
  
  pool = (MMDB_data_pool_s *)calloc(1,0x220);
  if (pool != (MMDB_data_pool_s *)0x0) {
    if (size - 1 < 0x3ffffffffffffff) {
      pool->size = size;
      pMVar1 = (MMDB_entry_data_list_s *)calloc(size,0x40);
      pool->blocks[0] = pMVar1;
      if (pMVar1 != (MMDB_entry_data_list_s *)0x0) {
        pMVar1->pool = pool;
        pool->sizes[0] = size;
        pool->block = pMVar1;
        return pool;
      }
    }
    data_pool_destroy(pool);
  }
  return (MMDB_data_pool_s *)0x0;
}

Assistant:

MMDB_data_pool_s *data_pool_new(size_t const size) {
    MMDB_data_pool_s *const pool = calloc(1, sizeof(MMDB_data_pool_s));
    if (!pool) {
        return NULL;
    }

    if (size == 0 ||
        !can_multiply(SIZE_MAX, size, sizeof(MMDB_entry_data_list_s))) {
        data_pool_destroy(pool);
        return NULL;
    }
    pool->size = size;
    pool->blocks[0] = calloc(pool->size, sizeof(MMDB_entry_data_list_s));
    if (!pool->blocks[0]) {
        data_pool_destroy(pool);
        return NULL;
    }
    pool->blocks[0]->pool = pool;

    pool->sizes[0] = size;

    pool->block = pool->blocks[0];

    return pool;
}